

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O0

void double_conversion::FillDigits64(uint64_t number,Vector<char> buffer,int *length)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  undefined4 in_EDX;
  undefined8 in_RSI;
  ulong in_RDI;
  uint32_t part0;
  uint32_t part1;
  uint32_t part2;
  uint32_t kTen7;
  int *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  uint32_t in_stack_ffffffffffffff84;
  char *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 uStack_4;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_RDI / 10000000;
  auVar2._8_4_ = 0;
  auVar2._0_8_ = in_RDI / 10000000;
  if (SUB124(auVar2 / ZEXT812(10000000),0) == 0) {
    if (SUB164(auVar1 % ZEXT816(10000000),0) == 0) {
      buffer_05._8_8_ = in_stack_ffffffffffffff90;
      buffer_05.start_ = in_stack_ffffffffffffff88;
      FillDigits32(in_stack_ffffffffffffff84,buffer_05,(int *)CONCAT44(uStack_4,in_EDX));
    }
    else {
      buffer_04._8_8_ = in_RSI;
      buffer_04.start_ = in_stack_ffffffffffffff88;
      FillDigits32(in_stack_ffffffffffffff84,buffer_04,in_stack_ffffffffffffff78);
      buffer_02.length_ = (int)in_RSI;
      buffer_02.start_ = (char *)in_stack_ffffffffffffff78;
      buffer_02._12_4_ = (int)((ulong)in_RSI >> 0x20);
      FillDigits32FixedLength
                ((uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70
                 ,buffer_02,in_stack_ffffffffffffff68);
    }
  }
  else {
    buffer_03._8_8_ = in_stack_ffffffffffffff90;
    buffer_03.start_ = in_stack_ffffffffffffff88;
    FillDigits32(in_stack_ffffffffffffff84,buffer_03,in_stack_ffffffffffffff78);
    buffer_00.length_ = in_stack_ffffffffffffff80;
    buffer_00.start_ = (char *)in_stack_ffffffffffffff78;
    buffer_00._12_4_ = in_stack_ffffffffffffff84;
    FillDigits32FixedLength
              ((uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70,
               buffer_00,in_stack_ffffffffffffff68);
    buffer_01.length_ = in_stack_ffffffffffffff80;
    buffer_01.start_ = (char *)in_stack_ffffffffffffff78;
    buffer_01._12_4_ = in_stack_ffffffffffffff84;
    FillDigits32FixedLength
              ((uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),(int)in_stack_ffffffffffffff70,
               buffer_01,in_stack_ffffffffffffff68);
  }
  return;
}

Assistant:

static void FillDigits64(uint64_t number, Vector<char> buffer, int* length) {
  const uint32_t kTen7 = 10000000;
  // For efficiency cut the number into 3 uint32_t parts, and print those.
  uint32_t part2 = static_cast<uint32_t>(number % kTen7);
  number /= kTen7;
  uint32_t part1 = static_cast<uint32_t>(number % kTen7);
  uint32_t part0 = static_cast<uint32_t>(number / kTen7);

  if (part0 != 0) {
    FillDigits32(part0, buffer, length);
    FillDigits32FixedLength(part1, 7, buffer, length);
    FillDigits32FixedLength(part2, 7, buffer, length);
  } else if (part1 != 0) {
    FillDigits32(part1, buffer, length);
    FillDigits32FixedLength(part2, 7, buffer, length);
  } else {
    FillDigits32(part2, buffer, length);
  }
}